

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O1

void __thiscall Wasm::WasmBinaryReader::ValidateModuleHeader(WasmBinaryReader *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint sourceContextId;
  undefined4 *puVar5;
  char16_t *msg;
  FunctionBody *pFVar6;
  
  if ((DAT_015aa2e2 == '\0') && (0x40000000 < (uint)(*(int *)&this->m_end - *(int *)&this->m_pc))) {
    msg = L"Module too big";
    goto LAB_00f247e7;
  }
  uVar3 = ReadConst<unsigned_int>(this);
  uVar4 = ReadConst<unsigned_int>(this);
  pFVar6 = (this->m_funcState).body;
  if (pFVar6 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
    this = (WasmBinaryReader *)&DAT_015cd718;
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,WasmReaderPhase);
    if (bVar2) {
LAB_00f246d2:
      Output::Print(L"Module Header: Magic 0x%x, Version %u",(ulong)uVar3,(ulong)uVar4);
      this = (WasmBinaryReader *)0xfcdf42;
      Output::Print(L"\n");
      Output::Flush();
    }
  }
  else {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar6);
    if (this->m_readerState == READER_STATE_FUNCTION) {
      pFVar6 = (this->m_funcState).body;
    }
    else {
      pFVar6 = (FunctionBody *)0x0;
    }
    if ((pFVar6->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    this = (WasmBinaryReader *)&DAT_015cd718;
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015cd718,WasmReaderPhase,sourceContextId,
                       ((pFVar6->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                       ->functionId);
    if (bVar2) goto LAB_00f246d2;
  }
  if (uVar3 == 0x6d736100) {
    if ((uVar4 == 1) || (DAT_015aa2e0 == '\0')) {
      return;
    }
    msg = L"Invalid WASM version!";
  }
  else {
    msg = L"Malformed WASM module header!";
  }
LAB_00f247e7:
  ThrowDecodingError(this,msg);
}

Assistant:

void WasmBinaryReader::ValidateModuleHeader()
{
    uint32 bytesLeft = (uint32)(m_end - m_pc);
    if (bytesLeft > Limits::GetMaxModuleSize())
    {
        ThrowDecodingError(_u("Module too big"));
    }

    uint32 magicNumber = ReadConst<uint32>();
    uint32 version = ReadConst<uint32>();
    TRACE_WASM_DECODER(_u("Module Header: Magic 0x%x, Version %u"), magicNumber, version);
    if (magicNumber != 0x6d736100)
    {
        ThrowDecodingError(_u("Malformed WASM module header!"));
    }

    if (CONFIG_FLAG(WasmCheckVersion))
    {
        if (version != binaryVersion)
        {
            ThrowDecodingError(_u("Invalid WASM version!"));
        }
    }
}